

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int EVP_HPKE_KEY_generate(EVP_HPKE_KEY *key,EVP_HPKE_KEM *kem)

{
  int iVar1;
  EVP_HPKE_KEM *kem_local;
  EVP_HPKE_KEY *key_local;
  
  EVP_HPKE_KEY_zero(key);
  key->kem = kem;
  iVar1 = (*kem->generate_key)(key);
  if (iVar1 == 0) {
    key->kem = (EVP_HPKE_KEM *)0x0;
  }
  key_local._4_4_ = (uint)(iVar1 != 0);
  return key_local._4_4_;
}

Assistant:

int EVP_HPKE_KEY_generate(EVP_HPKE_KEY *key, const EVP_HPKE_KEM *kem) {
  EVP_HPKE_KEY_zero(key);
  key->kem = kem;
  if (!kem->generate_key(key)) {
    key->kem = NULL;
    return 0;
  }
  return 1;
}